

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O2

pair<unsigned_char,_unsigned_char> __thiscall
MedianFilterCV_8U::getPairMedian(MedianFilterCV_8U *this,Mat *image,int y,int x,bool pairOnOneLine)

{
  uchar *__a;
  uchar *__b;
  uchar *__a_00;
  uchar *__b_00;
  uchar uVar1;
  pair<unsigned_char,_unsigned_char> pVar2;
  int iVar3;
  int y_00;
  MedianFilterCV_8U *pMVar4;
  undefined7 in_register_00000081;
  uchar mergeResult [6];
  
  iVar3 = x;
  if ((int)CONCAT71(in_register_00000081,pairOnOneLine) != 0) {
    iVar3 = y;
  }
  if (iVar3 == 1) {
    if (!pairOnOneLine) {
      iVar3 = x + -1;
      y_00 = y;
    }
    else {
      iVar3 = x;
      y_00 = y + -1;
    }
    pMVar4 = this;
    initThreeAdjacentPixels(this,image,this->thirdTempArray,y_00,iVar3,pairOnOneLine);
    initThreeAdjacentPixels(pMVar4,image,this->fourthTempArray,y,x,pairOnOneLine);
    sortThreeElements(this,this->thirdTempArray);
    sortThreeElements(this,this->fourthTempArray);
  }
  __a = this->firstTempArray;
  __b = this->thirdTempArray;
  std::swap<unsigned_char,3ul>((uchar (*) [3])__a,(uchar (*) [3])__b);
  __a_00 = this->secondTempArray;
  __b_00 = this->fourthTempArray;
  pMVar4 = (MedianFilterCV_8U *)__a_00;
  std::swap<unsigned_char,3ul>((uchar (*) [3])__a_00,(uchar (*) [3])__b_00);
  if (!pairOnOneLine) {
    initThreeAdjacentPixels(pMVar4,image,__b,y,x + 1,false);
    x = x + 2;
  }
  else {
    initThreeAdjacentPixels(pMVar4,image,__b,y + 1,x,true);
    y = y + 2;
  }
  initThreeAdjacentPixels(pMVar4,image,__b_00,y,x,pairOnOneLine);
  sortThreeElements(this,__b);
  sortThreeElements(this,__b_00);
  mergeTwoSortedArray(this,__a_00,3,__b,3,mergeResult);
  pVar2.first = getMedianOfTwoSortedArray(this,mergeResult,6,__a,3);
  uVar1 = getMedianOfTwoSortedArray(this,mergeResult,6,__b_00,3);
  pVar2.second = uVar1;
  return pVar2;
}

Assistant:

std::pair<uchar, uchar> MedianFilterCV_8U::getPairMedian(const cv::Mat &image, int y, int x, bool pairOnOneLine) {
    // PairOnOneLine - true, if we are looking for medians on one line,
    //                false, if on one column
    if ((x == 1 && !pairOnOneLine) || (y == 1 && pairOnOneLine)) {                         // 7 operations
        //if we are looking for median on second line or second column
        //need init must fill out and initialize third and fourth temp array
        if (pairOnOneLine) {                                                               // 1 operation
            initThreeAdjacentPixels(image, thirdTempArray, y - 1, x, pairOnOneLine);       // 14| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        } else {
            initThreeAdjacentPixels(image, thirdTempArray, y, x - 1, pairOnOneLine);       // 13| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        }

        sortThreeElements(thirdTempArray);                                                 // 43| 1 operations + operations of sort(42)
        sortThreeElements(fourthTempArray);                                                // 43| 1 operations + operations of sort(42)
    }

    // The values ​​sorted in the last step are written to first and second temp array
    std::swap(firstTempArray, thirdTempArray);                                             // 4 operations
    std::swap(secondTempArray, fourthTempArray);                                           // 4 operations

    if (pairOnOneLine) {                                                                   // 1 operation
        initThreeAdjacentPixels(image, thirdTempArray, y + 1, x, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y + 2, x, pairOnOneLine);          // 2 operations
    } else {
        initThreeAdjacentPixels(image, thirdTempArray, y, x + 1, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y, x + 2, pairOnOneLine);          // 2 operations
    }

    sortThreeElements(thirdTempArray);                                                     // 43| 1 operation + operations of sort(42)
    sortThreeElements(fourthTempArray);                                                    // 43| 1 operation + operations of sort(42)

    uchar mergeResult[6];                                                                  // 1 operation
    mergeTwoSortedArray(secondTempArray, 3, thirdTempArray, 3, mergeResult);               // 118| 1 operation + operations of merge(117)

    std::pair<uchar, uchar> pairOfMedians;                                                 // 1 operations

    pairOfMedians.first = getMedianOfTwoSortedArray(mergeResult, 6, firstTempArray, 3);    // 98| 3 operations + opeations of getMedian(95)
    pairOfMedians.second = getMedianOfTwoSortedArray(mergeResult, 6, fourthTempArray, 3);  // 98| 3 operations + opeations of getMedian(95)

    return pairOfMedians;                                                                  // 1 operation
}